

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_shexp.hpp
# Opt level: O1

SH<15> * log_visibility(SH<15> *__return_storage_ptr__,vec3f cluster_center,
                       vector<Sphere,_std::allocator<Sphere>_> *blockers)

{
  pointer pSVar1;
  undefined8 uVar2;
  int i_1;
  int iVar3;
  long lVar4;
  SH<15> *pSVar5;
  int i;
  long lVar6;
  SH<15> *pSVar7;
  undefined8 *puVar8;
  long lVar9;
  pointer pSVar10;
  float fVar11;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar12;
  float fVar13;
  float fVar14;
  vec3f w;
  SymmSH<15> symmlog;
  SymmSH<15> c_1;
  SymmSH<15> c;
  SymmSH<15> local_7e8;
  undefined1 local_7a8 [16];
  float local_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  undefined1 local_788 [16];
  undefined1 local_778 [16];
  vector<SymmSH<15>,_std::allocator<SymmSH<15>_>_> local_760;
  SH<15> local_748;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 uStack_398;
  undefined4 uStack_390;
  undefined4 local_38c;
  undefined4 uStack_388;
  undefined8 uStack_384;
  
  local_7a8._8_4_ = in_XMM0_Dc;
  local_7a8._0_8_ = cluster_center._0_8_;
  local_7a8._12_4_ = in_XMM0_Dd;
  if ((log_visibility(vec3f,std::vector<Sphere,std::allocator<Sphere>>)::init == '\0') &&
     (iVar3 = __cxa_guard_acquire(&log_visibility(vec3f,std::vector<Sphere,std::allocator<Sphere>>)
                                   ::init), iVar3 != 0)) {
    anon_unknown.dwarf_3d8b9::loadlut_cpu();
    __cxa_guard_release(&log_visibility(vec3f,std::vector<Sphere,std::allocator<Sphere>>)::init);
  }
  memset(__return_storage_ptr__,0,900);
  pSVar10 = (blockers->super__Vector_base<Sphere,_std::allocator<Sphere>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pSVar1 = (blockers->super__Vector_base<Sphere,_std::allocator<Sphere>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar10 != pSVar1) {
    local_798 = (float)local_7a8._4_4_;
    fStack_794 = (float)local_7a8._4_4_;
    fStack_790 = (float)local_7a8._4_4_;
    fStack_78c = (float)local_7a8._4_4_;
    do {
      fVar14 = pSVar10->radius;
      fVar12 = (pSVar10->center).x - (float)local_7a8._0_4_;
      fVar11 = (pSVar10->center).y - local_798;
      fVar13 = (pSVar10->center).z - cluster_center.z;
      local_788 = ZEXT416((uint)fVar11);
      local_778 = ZEXT416((uint)fVar12);
      fVar11 = fVar13 * fVar13 + fVar12 * fVar12 + fVar11 * fVar11;
      if (fVar11 < 0.0) {
        fVar12 = sqrtf(fVar11);
      }
      else {
        fVar12 = SQRT(fVar11);
      }
      fVar14 = fVar14 / fVar12;
      fVar12 = 1.0;
      if (fVar14 <= 1.0) {
        fVar12 = fVar14;
      }
      fVar14 = asinf(fVar12);
      std::vector<SymmSH<15>,_std::allocator<SymmSH<15>_>_>::vector
                (&local_760,
                 (vector<SymmSH<15>,_std::allocator<SymmSH<15>_>_> *)&(anonymous_namespace)::log_lut
                );
      fVar12 = (float)(((long)local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x1111111111111111
                      - 1);
      fVar14 = (fVar14 / (PI * 0.5)) * fVar12;
      if (fVar14 <= 0.0) {
        local_7e8.a[0] =
             (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
              super__Vector_impl_data._M_start)->a[0];
        local_7e8.a[1] =
             (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
              super__Vector_impl_data._M_start)->a[1];
        local_7e8.a[2] =
             (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
              super__Vector_impl_data._M_start)->a[2];
        local_7e8.a[3] =
             (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
              super__Vector_impl_data._M_start)->a[3];
        local_7e8.a[4] =
             (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
              super__Vector_impl_data._M_start)->a[4];
        local_7e8.a[5] =
             (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
              super__Vector_impl_data._M_start)->a[5];
        local_7e8.a[6] =
             (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
              super__Vector_impl_data._M_start)->a[6];
        local_7e8.a[7] =
             (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
              super__Vector_impl_data._M_start)->a[7];
        local_7e8.a[8] =
             (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
              super__Vector_impl_data._M_start)->a[8];
        local_7e8.a[9] =
             (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
              super__Vector_impl_data._M_start)->a[9];
        local_7e8.a[10] =
             (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
              super__Vector_impl_data._M_start)->a[10];
        local_7e8.a[0xb] =
             (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
              super__Vector_impl_data._M_start)->a[0xb];
        local_7e8.a[0xc] =
             (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
              super__Vector_impl_data._M_start)->a[0xc];
        local_7e8.a[0xd] =
             (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
              super__Vector_impl_data._M_start)->a[0xd];
        local_7e8.a[0xe] =
             (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
              super__Vector_impl_data._M_start)->a[0xe];
LAB_0015a084:
      }
      else {
        if (fVar12 <= fVar14) {
          local_7e8.a[0] =
               local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].a[0];
          local_7e8.a[1] =
               local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].a[1];
          local_7e8.a[2] =
               local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].a[2];
          local_7e8.a[3] =
               local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].a[3];
          local_7e8.a[4] =
               local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].a[4];
          local_7e8.a[5] =
               local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].a[5];
          local_7e8.a[6] =
               local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].a[6];
          local_7e8.a[7] =
               local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].a[7];
          local_7e8.a[8] =
               local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].a[8];
          local_7e8.a[9] =
               local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].a[9];
          local_7e8.a[10] =
               local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].a[10];
          local_7e8.a[0xb] =
               local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].a[0xb];
          local_7e8.a[0xc] =
               local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].a[0xc];
          local_7e8.a[0xd] =
               local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].a[0xd];
          local_7e8.a[0xe] =
               local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].a[0xe];
          goto LAB_0015a084;
        }
        lVar4 = (long)(int)fVar14;
        uVar2 = *(undefined8 *)
                 (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar4].a + 8 + 2);
        uStack_388 = (undefined4)
                     ((ulong)*(undefined8 *)
                              (local_760.
                               super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
                               super__Vector_impl_data._M_start[lVar4].a + 0xb) >> 0x20);
        uStack_384 = *(undefined8 *)
                      (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar4].a + 0xb + 2);
        uStack_398 = *(undefined8 *)
                      (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar4].a + 8);
        uStack_390 = (undefined4)uVar2;
        local_38c = (undefined4)((ulong)uVar2 >> 0x20);
        local_3a8 = *(undefined8 *)
                     (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl
                      .super__Vector_impl_data._M_start[lVar4].a + 4);
        uStack_3a0 = *(undefined8 *)
                      (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar4].a + 4 + 2);
        local_3b8 = *(undefined8 *)
                     local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar4].a;
        uStack_3b0 = *(undefined8 *)
                      (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar4].a + 2);
        lVar6 = 0;
        do {
          *(float *)((long)&local_3b8 + lVar6 * 4) =
               *(float *)((long)&local_3b8 + lVar6 * 4) * (1.0 - (fVar14 - (float)(int)fVar14));
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0xf);
        local_748.a[0xc] =
             (float)((ulong)*(undefined8 *)
                             (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar4 + 1].a + 0xb) >> 0x20)
        ;
        local_748.a._52_8_ =
             *(undefined8 *)
              (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
               super__Vector_impl_data._M_start[lVar4 + 1].a + 0xd);
        local_748.a._32_8_ =
             *(undefined8 *)
              (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
               super__Vector_impl_data._M_start[lVar4 + 1].a + 8);
        local_748.a[10] =
             (float)*(undefined8 *)
                     (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl
                      .super__Vector_impl_data._M_start[lVar4 + 1].a + 10);
        local_748.a[0xb] =
             (float)((ulong)*(undefined8 *)
                             (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar4 + 1].a + 10) >> 0x20);
        local_748.a._16_8_ =
             *(undefined8 *)
              (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
               super__Vector_impl_data._M_start[lVar4 + 1].a + 4);
        local_748.a._24_8_ =
             *(undefined8 *)
              (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
               super__Vector_impl_data._M_start[lVar4 + 1].a + 6);
        local_748.a._0_8_ =
             *(undefined8 *)
              local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
              super__Vector_impl_data._M_start[lVar4 + 1].a;
        local_748.a._8_8_ =
             *(undefined8 *)
              (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
               super__Vector_impl_data._M_start[lVar4 + 1].a + 2);
        lVar4 = 0;
        do {
          local_748.a[lVar4] = local_748.a[lVar4] * (fVar14 - (float)(int)fVar14);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0xf);
        local_7e8.a[0xc] = 0.0;
        local_7e8.a[0xd] = 0.0;
        local_7e8.a[0xe] = 0.0;
        local_7e8.a[8] = 0.0;
        local_7e8.a[9] = 0.0;
        local_7e8.a[10] = 0.0;
        local_7e8.a[0xb] = 0.0;
        local_7e8.a[4] = 0.0;
        local_7e8.a[5] = 0.0;
        local_7e8.a[6] = 0.0;
        local_7e8.a[7] = 0.0;
        local_7e8.a[0] = 0.0;
        local_7e8.a[1] = 0.0;
        local_7e8.a[2] = 0.0;
        local_7e8.a[3] = 0.0;
        lVar4 = 0;
        do {
          local_7e8.a[lVar4] = *(float *)((long)&local_3b8 + lVar4 * 4) + local_748.a[lVar4];
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0xf);
      }
      if (local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_760.super__Vector_base<SymmSH<15>,_std::allocator<SymmSH<15>_>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (fVar11 < 0.0) {
        fVar11 = sqrtf(fVar11);
      }
      else {
        fVar11 = SQRT(fVar11);
      }
      fVar11 = 1.0 / fVar11;
      w.x = (float)local_778._0_4_ * fVar11;
      w.z = fVar13 * fVar11;
      w.y = (float)local_788._0_4_ * fVar11;
      SymmSH<15>::rotated(&local_748,&local_7e8,w);
      memset(&local_3b8,0,900);
      lVar4 = 4;
      lVar6 = 0;
      pSVar5 = __return_storage_ptr__;
      pSVar7 = &local_748;
      puVar8 = &local_3b8;
      do {
        lVar6 = lVar6 + 1;
        lVar9 = 0;
        do {
          *(float *)((long)puVar8 + lVar9) =
               *(float *)((long)pSVar5->a + lVar9) + *(float *)((long)pSVar7->a + lVar9);
          lVar9 = lVar9 + 4;
        } while (lVar4 != lVar9);
        puVar8 = (undefined8 *)((long)puVar8 + lVar4);
        pSVar7 = (SH<15> *)((long)pSVar7->a + lVar4);
        pSVar5 = (SH<15> *)((long)pSVar5->a + lVar4);
        lVar4 = lVar4 + 8;
      } while (lVar6 != 0xf);
      memcpy(__return_storage_ptr__,&local_3b8,900);
      pSVar10 = pSVar10 + 1;
    } while (pSVar10 != pSVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

SH<shorder> log_visibility(vec3f cluster_center, std::vector<Sphere> blockers)
{
	static int init = loadlut_cpu();
	SH<shorder> f;
	for (Sphere sph: blockers)
	{
        vec3f v = sph.center - cluster_center;
        float angle = asin(std::min(sph.radius / norm(v), 1.0f));
        SymmSH<shorder> symmlog = log_lookup(angle);
        f = f + symmlog.rotated(normalized(v));
	}
	return f;
}